

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O1

bool can_pk(CHAR_DATA *ch,CHAR_DATA *victim)

{
  uint uVar1;
  bool bVar2;
  byte bVar3;
  uint uVar4;
  double dVar5;
  double dVar6;
  
  if (ch == victim) {
    bVar3 = 1;
    goto LAB_002a39f8;
  }
  if (victim != (CHAR_DATA *)0x0 && ch != (CHAR_DATA *)0x0) {
    uVar4 = (int)victim->level - (int)ch->level;
    uVar1 = -uVar4;
    if (0 < (int)uVar4) {
      uVar1 = uVar4;
    }
    bVar2 = is_npc(ch);
    if ((((!bVar2) && (bVar2 = is_npc(victim), !bVar2)) && (ch->ghost < 1)) &&
       ((victim->ghost < 1 && (0x16 < ch->level)))) {
      bVar3 = 0;
      if ((victim->level < 0x17) || (bVar3 = 0, 9 < (uVar1 & 0xffff))) goto LAB_002a39f8;
      bVar2 = is_npc(ch);
      if ((((!bVar2) && (bVar2 = is_npc(victim), !bVar2)) && (ch->level == 0x33)) &&
         (victim->level == 0x33)) {
        bVar3 = 1;
        goto LAB_002a39f8;
      }
      if ((9999 < victim->exp && 9999 < ch->exp) &&
         (((int)ch->level - (int)victim->level) + 0x16U < 0x2d)) {
        dVar5 = (double)ch->exp;
        dVar6 = (double)victim->exp;
        if ((dVar6 <= dVar5 * 0.7) || (bVar3 = 1, dVar5 * 1.3 <= dVar6)) {
          bVar3 = -(dVar5 < dVar6 * 1.3) & -(dVar6 * 0.7 < dVar5);
        }
        goto LAB_002a39f8;
      }
    }
  }
  bVar3 = 0;
LAB_002a39f8:
  return (bool)(bVar3 & 1);
}

Assistant:

bool can_pk(CHAR_DATA *ch, CHAR_DATA *victim)
{
	int xp, vxp;

	if (ch == victim)
		return true;

	if (ch == nullptr || victim == nullptr)
		return false;

	int levelDif = victim->level - ch->level;

	if (levelDif <= -1)
		levelDif *= -1;

	if (is_npc(ch)
		|| is_npc(victim)
		|| ch->ghost > 0
		|| victim->ghost > 0
		|| ch->level < MIN_LEVEL_TO_PK
		|| victim->level < MIN_LEVEL_TO_PK
		|| levelDif > 9) // abs(victim->level - ch->level)
	{
		return false;
	}

	if (!is_npc(ch)
		&& !is_npc(victim)
		&& ch->level == LEVEL_HERO
		&& victim->level == LEVEL_HERO)
	{
		return true;
	}

	xp = ch->exp;
	vxp = victim->exp;

	if (xp > MIN_PK_XP && vxp > MIN_PK_XP)
	{
		if (ch->level - victim->level < MIN_LEVEL_TO_PK && ch->level - victim->level > -MIN_LEVEL_TO_PK)
		{
			if (((xp * .7) < vxp) && ((xp * 1.3) > vxp))
				return true;
			else if (((vxp * .7) < xp) && ((vxp * 1.3) > xp))
				return true;
			else
				return false;
		}
		else
		{
			return false;
		}
	}
	else
	{
		return false;
	}
}